

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXExportNode.cpp
# Opt level: O3

void __thiscall
Assimp::FBX::Node::Dump(Node *this,shared_ptr<Assimp::IOStream> *outfile,bool binary,int indent)

{
  element_type *peVar1;
  undefined7 in_register_00000011;
  string s;
  StreamWriterLE outstream;
  shared_ptr<Assimp::IOStream> local_1c8;
  undefined1 *local_1b8;
  undefined8 local_1b0;
  undefined1 local_1a8 [16];
  StreamWriter<false,_false> local_198 [2];
  ios_base local_128 [264];
  
  if ((int)CONCAT71(in_register_00000011,binary) == 0) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_198);
    DumpAscii(this,(ostream *)local_198,indent);
    std::__cxx11::stringbuf::str();
    peVar1 = (outfile->super___shared_ptr<Assimp::IOStream,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    (*peVar1->_vptr_IOStream[3])(peVar1,local_1b8,local_1b0,1);
    if (local_1b8 != local_1a8) {
      operator_delete(local_1b8);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_198);
    std::ios_base::~ios_base(local_128);
  }
  else {
    local_1c8.super___shared_ptr<Assimp::IOStream,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (outfile->super___shared_ptr<Assimp::IOStream,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    local_1c8.super___shared_ptr<Assimp::IOStream,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (outfile->super___shared_ptr<Assimp::IOStream,_(__gnu_cxx::_Lock_policy)2>)._M_refcount.
         _M_pi;
    if (local_1c8.super___shared_ptr<Assimp::IOStream,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
        != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        (local_1c8.super___shared_ptr<Assimp::IOStream,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi)->_M_use_count =
             (local_1c8.super___shared_ptr<Assimp::IOStream,_(__gnu_cxx::_Lock_policy)2>._M_refcount
             ._M_pi)->_M_use_count + 1;
        UNLOCK();
      }
      else {
        (local_1c8.super___shared_ptr<Assimp::IOStream,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi)->_M_use_count =
             (local_1c8.super___shared_ptr<Assimp::IOStream,_(__gnu_cxx::_Lock_policy)2>._M_refcount
             ._M_pi)->_M_use_count + 1;
      }
    }
    StreamWriter<false,_false>::StreamWriter(local_198,&local_1c8,false);
    if (local_1c8.super___shared_ptr<Assimp::IOStream,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
        != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_1c8.super___shared_ptr<Assimp::IOStream,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
    DumpBinary(this,local_198);
    StreamWriter<false,_false>::~StreamWriter(local_198);
  }
  return;
}

Assistant:

void FBX::Node::Dump(
    std::shared_ptr<Assimp::IOStream> outfile,
    bool binary, int indent
) {
    if (binary) {
        Assimp::StreamWriterLE outstream(outfile);
        DumpBinary(outstream);
    } else {
        std::ostringstream ss;
        DumpAscii(ss, indent);
        std::string s = ss.str();
        outfile->Write(s.c_str(), s.size(), 1);
    }
}